

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_dist.cpp
# Opt level: O0

LO __thiscall Omega_h::Dist::nroots(Dist *this)

{
  LOs *pLVar1;
  Dist *this_local;
  ulong local_10;
  
  pLVar1 = this->roots2items_;
  if (((ulong)(pLVar1->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((pLVar1->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(pLVar1->write_).shared_alloc_.alloc >> 3;
  }
  return (int)(local_10 >> 2) + -1;
}

Assistant:

LO Dist::nroots() const { return roots2items_[F].size() - 1; }